

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey_test.c
# Opt level: O2

void test_surv_cancel_abort_recv(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err nVar3;
  char *pcVar4;
  char *pcVar5;
  int local_88 [2];
  char buf_ [64];
  size_t sz_;
  nng_aio *aio;
  nng_socket resp;
  nng_socket surv;
  
  nVar1 = nng_respondent0_open((nng_socket *)&aio);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xd7,"%s: expected success, got %s (%d)","nng_respondent0_open(&resp)",
                         pcVar4,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_surveyor0_open((nng_socket *)((long)&aio + 4));
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                           ,0xd8,"%s: expected success, got %s (%d)","nng_surveyor0_open(&surv)",
                           pcVar4,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_aio_alloc((nng_aio **)&sz_,(_func_void_void_ptr *)0x0,(void *)0x0);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                             ,0xd9,"%s: expected success, got %s (%d)",
                             "nng_aio_alloc(&aio, NULL, NULL)",pcVar4,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_set_ms(aio._4_4_,"surveyor:survey-time",10000);
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                               ,0xdb,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(surv, NNG_OPT_SURVEYOR_SURVEYTIME, time)",pcVar4,
                               nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_set_int(aio._4_4_,"send-buffer",0x10);
          pcVar4 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                 ,0xdc,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_int(surv, NNG_OPT_SENDBUF, 16)",pcVar4,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_socket_set_ms(aio._4_4_,"recv-timeout",5000);
            pcVar4 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                   ,0xdd,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(surv, NNG_OPT_RECVTIMEO, 5 * SECOND)",pcVar4,
                                   nVar1);
            if (iVar2 != 0) {
              nVar1 = nng_socket_set_ms(aio._0_4_,"recv-timeout",5000);
              pcVar4 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                     ,0xde,"%s: expected success, got %s (%d)",
                                     "nng_socket_set_ms(resp, NNG_OPT_RECVTIMEO, 5 * SECOND)",pcVar4
                                     ,nVar1);
              if (iVar2 != 0) {
                nVar1 = nng_socket_set_ms(aio._4_4_,"send-timeout",5000);
                pcVar4 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                       ,0xdf,"%s: expected success, got %s (%d)",
                                       "nng_socket_set_ms(surv, NNG_OPT_SENDTIMEO, 5 * SECOND)",
                                       pcVar4,nVar1);
                if (iVar2 != 0) {
                  nVar1 = nng_socket_set_ms(aio._0_4_,"send-timeout",5000);
                  pcVar4 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                         ,0xe0,"%s: expected success, got %s (%d)",
                                         "nng_socket_set_ms(resp, NNG_OPT_SENDTIMEO, 5 * SECOND)",
                                         pcVar4,nVar1);
                  if (iVar2 != 0) {
                    nVar1 = nuts_marry(aio._0_4_,aio._4_4_);
                    pcVar4 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                           ,0xe2,"%s: expected success, got %s (%d)",
                                           "nuts_marry(resp, surv)",pcVar4,nVar1);
                    if (iVar2 != 0) {
                      nVar1 = nng_send(aio._4_4_,"abc",4,0);
                      pcVar4 = nng_strerror(nVar1);
                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                             ,0xe5,"%s: expected success, got %s (%d)",
                                             "nng_send(surv, \"abc\", strlen(\"abc\") + 1, 0)",
                                             pcVar4,nVar1);
                      if (iVar2 != 0) {
                        nuts_sleep(100);
                        nng_aio_set_timeout((nng_aio *)sz_,5000);
                        nng_socket_recv(aio._4_4_,(nng_aio *)sz_);
                        nuts_sleep(100);
                        nVar1 = nng_send(aio._4_4_,"def",4,0);
                        pcVar4 = nng_strerror(nVar1);
                        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                               ,0xf4,"%s: expected success, got %s (%d)",
                                               "nng_send(surv, \"def\", strlen(\"def\") + 1, 0)",
                                               pcVar4,nVar1);
                        if (iVar2 != 0) {
                          nng_aio_wait((nng_aio *)sz_);
                          nVar3 = nng_aio_result((nng_aio *)sz_);
                          pcVar4 = nng_strerror(NNG_ECANCELED);
                          acutest_check_((uint)(nVar3 == NNG_ECANCELED),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                         ,0xf8,"%s fails with %s","nng_aio_result(aio)",pcVar4,nVar1
                                        );
                          pcVar4 = nng_strerror(NNG_ECANCELED);
                          pcVar5 = nng_strerror(nVar3);
                          acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio)"
                                           ,pcVar4,0x14,pcVar5,(ulong)nVar3);
                          buf_[0x38] = '@';
                          buf_[0x39] = '\0';
                          buf_[0x3a] = '\0';
                          buf_[0x3b] = '\0';
                          buf_[0x3c] = '\0';
                          buf_[0x3d] = '\0';
                          buf_[0x3e] = '\0';
                          buf_[0x3f] = '\0';
                          nVar1 = nng_recv(aio._0_4_,local_88,(size_t *)(buf_ + 0x38),0);
                          pcVar4 = nng_strerror(nVar1);
                          acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                         ,0xfb,"nng_recv (%d %s)",(ulong)nVar1,pcVar4);
                          acutest_check_((uint)(buf_._56_8_ == 4),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                         ,0xfb,"length %d want %d",buf_._56_8_,4);
                          buf_[0x37] = '\0';
                          acutest_check_((uint)(local_88[0] == 0x636261),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                         ,0xfb,"%s == %s","abc",local_88);
                          nVar1 = nng_send(aio._0_4_,"abc",4,0);
                          pcVar4 = nng_strerror(nVar1);
                          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                                 ,0xff,"%s: expected success, got %s (%d)",
                                                 "nng_send(resp, \"abc\", strlen(\"abc\") + 1, 0)",
                                                 pcVar4,nVar1);
                          if (iVar2 != 0) {
                            buf_[0x38] = '@';
                            buf_[0x39] = '\0';
                            buf_[0x3a] = '\0';
                            buf_[0x3b] = '\0';
                            buf_[0x3c] = '\0';
                            buf_[0x3d] = '\0';
                            buf_[0x3e] = '\0';
                            buf_[0x3f] = '\0';
                            nVar3 = nng_recv(aio._0_4_,local_88,(size_t *)(buf_ + 0x38),0);
                            pcVar4 = nng_strerror(nVar3);
                            acutest_check_((uint)(nVar3 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                           ,0x102,"nng_recv (%d %s)",(ulong)nVar3,pcVar4,nVar1);
                            acutest_check_((uint)(buf_._56_8_ == 4),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                           ,0x102,"length %d want %d",buf_._56_8_,4);
                            buf_[0x37] = '\0';
                            acutest_check_((uint)(local_88[0] == 0x666564),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                           ,0x102,"%s == %s","def",local_88);
                            nVar1 = nng_send(aio._0_4_,"def",4,0);
                            pcVar4 = nng_strerror(nVar1);
                            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                                  ,0x105,"%s: expected success, got %s (%d)",
                                                  "nng_send(resp, \"def\", strlen(\"def\") + 1, 0)",
                                                  pcVar4,nVar1);
                            if (iVar2 != 0) {
                              buf_[0x38] = '@';
                              buf_[0x39] = '\0';
                              buf_[0x3a] = '\0';
                              buf_[0x3b] = '\0';
                              buf_[0x3c] = '\0';
                              buf_[0x3d] = '\0';
                              buf_[0x3e] = '\0';
                              buf_[0x3f] = '\0';
                              nVar3 = nng_recv(aio._4_4_,local_88,(size_t *)(buf_ + 0x38),0);
                              pcVar4 = nng_strerror(nVar3);
                              acutest_check_((uint)(nVar3 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                             ,0x108,"nng_recv (%d %s)",(ulong)nVar3,pcVar4,nVar1);
                              acutest_check_((uint)(buf_._56_8_ == 4),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                             ,0x108,"length %d want %d",buf_._56_8_,4);
                              buf_[0x37] = '\0';
                              acutest_check_((uint)(local_88[0] == 0x666564),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                             ,0x108,"%s == %s","def",local_88);
                              nng_aio_free((nng_aio *)sz_);
                              nVar1 = nng_socket_close(aio._4_4_);
                              pcVar4 = nng_strerror(nVar1);
                              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                                  ,0x10b,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(surv)",pcVar4,nVar1);
                              if (iVar2 != 0) {
                                nVar1 = nng_socket_close(aio._0_4_);
                                pcVar4 = nng_strerror(nVar1);
                                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                                                  ,0x10c,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(resp)",pcVar4,nVar1);
                                if (iVar2 != 0) {
                                  return;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_surv_cancel_abort_recv(void)
{
	nng_aio     *aio;
	nng_duration time = SECOND * 10; // 10s (kind of never)
	nng_socket   surv;
	nng_socket   resp;

	NUTS_PASS(nng_respondent0_open(&resp));
	NUTS_PASS(nng_surveyor0_open(&surv));
	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));

	NUTS_PASS(nng_socket_set_ms(surv, NNG_OPT_SURVEYOR_SURVEYTIME, time));
	NUTS_PASS(nng_socket_set_int(surv, NNG_OPT_SENDBUF, 16));
	NUTS_PASS(nng_socket_set_ms(surv, NNG_OPT_RECVTIMEO, 5 * SECOND));
	NUTS_PASS(nng_socket_set_ms(resp, NNG_OPT_RECVTIMEO, 5 * SECOND));
	NUTS_PASS(nng_socket_set_ms(surv, NNG_OPT_SENDTIMEO, 5 * SECOND));
	NUTS_PASS(nng_socket_set_ms(resp, NNG_OPT_SENDTIMEO, 5 * SECOND));

	NUTS_MARRY(resp, surv);

	// Send survey #1 (abc).
	NUTS_SEND(surv, "abc");

	// Wait for it to get ot the other side.
	NUTS_SLEEP(100);

	nng_aio_set_timeout(aio, 5 * SECOND);
	nng_socket_recv(surv, aio);

	// Give time for this recv to post properly.
	NUTS_SLEEP(100);

	// Send the next request ("def").  Note that
	// the respondent side server will have already buffered the receive
	// request, and should simply be waiting for us to reply to
	// abc.
	NUTS_SEND(surv, "def");

	// Our pending I/O should have been canceled.
	nng_aio_wait(aio);
	NUTS_FAIL(nng_aio_result(aio), NNG_ECANCELED);

	// Receive the first request (should be abc) on the respondent.
	NUTS_RECV(resp, "abc");

	// Respondent sends the reply to first survey.  This will be
	// discarded by the SURV socket.
	NUTS_SEND(resp, "abc");

	// Now get the next survey from the RESP; should be "def".
	NUTS_RECV(resp, "def");

	// And send it back to REQ.
	NUTS_SEND(resp, "def");

	// Try a req command.  This should give back "def"
	NUTS_RECV(surv, "def");

	nng_aio_free(aio);
	NUTS_CLOSE(surv);
	NUTS_CLOSE(resp);
}